

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O1

_Bool testbinaryfuse16pack(size_t size,size_t repeated_size)

{
  _Bool _Var1;
  binary_fuse16_t filter;
  
  printf("testing binary fuse16 pack/unpack with size %zu and %zu duplicates\n",size,repeated_size);
  _Var1 = test(size,repeated_size,&filter,binary_fuse16_allocate_gen,binary_fuse16_free_gen,
               binary_fuse16_size_in_bytes_gen,binary_fuse16_pack_bytes_gen,binary_fuse16_pack_gen,
               binary_fuse16_unpack_gen,binary_fuse16_populate_gen,binary_fuse16_contain_gen);
  return _Var1;
}

Assistant:

bool testbinaryfuse16pack(size_t size, size_t repeated_size) {
  printf("testing binary fuse16 pack/unpack with size %zu and %zu duplicates\n", size, repeated_size);
  binary_fuse16_t filter;
  return test(size, repeated_size, &filter,
              binary_fuse16_allocate_gen,
              binary_fuse16_free_gen,
              binary_fuse16_size_in_bytes_gen,
              binary_fuse16_pack_bytes_gen,
              binary_fuse16_pack_gen,
              binary_fuse16_unpack_gen,
              binary_fuse16_populate_gen,
              binary_fuse16_contain_gen);
}